

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# example3.cpp
# Opt level: O0

void __thiscall MyRTPSession::MyRTPSession(MyRTPSession *this)

{
  MyRTPSession *this_local;
  
  jrtplib::RTPSession::RTPSession(&this->super_RTPSession,(RTPRandom *)0x0,(RTPMemoryManager *)0x0);
  (this->super_RTPSession).super_RTPMemoryObject._vptr_RTPMemoryObject =
       (_func_int **)&PTR__MyRTPSession_00192968;
  return;
}

Assistant:

void OnNewSource(RTPSourceData *dat)
	{
		if (dat->IsOwnSSRC())
			return;

		uint32_t ip;
		uint16_t port;
		
		if (dat->GetRTPDataAddress() != 0)
		{
			const RTPIPv4Address *addr = (const RTPIPv4Address *)(dat->GetRTPDataAddress());
			ip = addr->GetIP();
			port = addr->GetPort();
		}
		else if (dat->GetRTCPDataAddress() != 0)
		{
			const RTPIPv4Address *addr = (const RTPIPv4Address *)(dat->GetRTCPDataAddress());
			ip = addr->GetIP();
			port = addr->GetPort()-1;
		}
		else
			return;
		
		RTPIPv4Address dest(ip,port);
		AddDestination(dest);

		struct in_addr inaddr;
		inaddr.s_addr = htonl(ip);
		std::cout << "Adding destination " << std::string(inet_ntoa(inaddr)) << ":" << port << std::endl;
	}